

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986Fragment(xmlURIPtr uri,char **str)

{
  int iVar1;
  uint uVar2;
  xmlChar *pxVar3;
  byte *cur;
  
  cur = (byte *)*str;
  while( true ) {
    iVar1 = xmlIsUnreserved(uri,(char *)cur);
    if ((iVar1 == 0) &&
       ((uVar2 = *cur - 0x21, 0x3c < uVar2 ||
        (((0x14000000d6004fe9U >> ((ulong)uVar2 & 0x3f) & 1) == 0 &&
         ((((ulong)uVar2 != 4 ||
           ((9 < (byte)(cur[1] - 0x30) &&
            ((uVar2 = cur[1] - 0x41, 0x25 < uVar2 ||
             ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))) ||
          ((9 < (byte)(cur[2] - 0x30) &&
           ((uVar2 = cur[2] - 0x41, 0x25 < uVar2 ||
            ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))))))))) break;
    cur = cur + (ulong)(*cur == 0x25) * 2 + 1;
  }
  if (uri != (xmlURIPtr)0x0) {
    if (uri->fragment != (char *)0x0) {
      (*xmlFree)(uri->fragment);
    }
    pxVar3 = (xmlChar *)*str;
    iVar1 = (int)cur - (int)pxVar3;
    if ((uri->cleanup & 2) == 0) {
      pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pxVar3,iVar1,(char *)0x0);
    }
    else {
      pxVar3 = xmlStrndup(pxVar3,iVar1);
    }
    uri->fragment = (char *)pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      return -1;
    }
  }
  *str = (char *)cur;
  return 0;
}

Assistant:

static int
xmlParse3986Fragment(xmlURIPtr uri, const char **str)
{
    const char *cur;

    cur = *str;

    while ((ISA_PCHAR(uri, cur)) || (*cur == '/') || (*cur == '?') ||
           (*cur == '[') || (*cur == ']'))
        NEXT(cur);
    if (uri != NULL) {
        if (uri->fragment != NULL)
            xmlFree(uri->fragment);
	if (uri->cleanup & XML_URI_NO_UNESCAPE)
	    uri->fragment = STRNDUP(*str, cur - *str);
	else
	    uri->fragment = xmlURIUnescapeString(*str, cur - *str, NULL);
        if (uri->fragment == NULL)
            return (-1);
    }
    *str = cur;
    return (0);
}